

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void lunasvg::handleTextChunk(SVGTextFragmentIterator begin,SVGTextFragmentIterator end)

{
  bool bVar1;
  LengthAdjust LVar2;
  reference pSVar3;
  SVGLength *length;
  reference pSVar4;
  float fVar5;
  float local_f0;
  float local_e4;
  SVGTextFragment *fragment_4;
  SVGTextFragmentIterator it_4;
  float chunkOffset;
  SVGTextFragment *fragment_3;
  SVGTextFragmentIterator it_3;
  SVGTextFragment *lastFragment_1;
  float chunkWidth_1;
  SVGTextFragment *fragment_2;
  SVGTextFragmentIterator it_2;
  ulong uStack_90;
  float textLengthShift;
  size_t characterOffset;
  SVGTextFragment *fragment_1;
  SVGTextFragmentIterator it_1;
  Transform lengthAdjustTransform;
  float textLengthScale;
  float textLength;
  LengthContext lengthContext;
  SVGTextFragment *fragment;
  SVGTextFragmentIterator it;
  SVGTextFragment *lastFragment;
  size_t numCharacters;
  float chunkWidth;
  SVGTextFragment *firstFragment;
  SVGTextFragmentIterator end_local;
  SVGTextFragmentIterator begin_local;
  
  firstFragment = end._M_current;
  end_local = begin;
  pSVar3 = __gnu_cxx::
           __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
           ::operator*(&end_local);
  bVar1 = SVGElement::hasAttribute((SVGElement *)pSVar3->element,TextLength);
  if (bVar1) {
    numCharacters._4_4_ = 0.0;
    lastFragment = (SVGTextFragment *)0x0;
    it._M_current = (SVGTextFragment *)0x0;
    fragment = end_local._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&fragment,
                              (__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&firstFragment), bVar1) {
      lengthContext._8_8_ =
           __gnu_cxx::
           __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
           ::operator*((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                        *)&fragment);
      lastFragment = (SVGTextFragment *)
                     ((long)&lastFragment->element + ((reference)lengthContext._8_8_)->length);
      numCharacters._4_4_ = ((reference)lengthContext._8_8_)->width + numCharacters._4_4_;
      if (it._M_current != (SVGTextFragment *)0x0) {
        numCharacters._4_4_ =
             (((reference)lengthContext._8_8_)->x - ((it._M_current)->x + (it._M_current)->width)) +
             numCharacters._4_4_;
      }
      it._M_current = (SVGTextFragment *)lengthContext._8_8_;
      __gnu_cxx::
      __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
      ::operator++((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                    *)&fragment);
    }
    LengthContext::LengthContext
              ((LengthContext *)&textLengthScale,(SVGElement *)pSVar3->element,UserSpaceOnUse);
    length = SVGTextPositioningElement::textLength(pSVar3->element);
    fVar5 = LengthContext::valueForLength((LengthContext *)&textLengthScale,length);
    if ((0.0 < fVar5) && (0.0 < numCharacters._4_4_)) {
      LVar2 = SVGTextPositioningElement::lengthAdjust(pSVar3->element);
      if (LVar2 == SpacingAndGlyphs) {
        Transform::translated((Transform *)&it_1,pSVar3->x,pSVar3->y);
        Transform::scale((Transform *)&it_1,fVar5 / numCharacters._4_4_,1.0);
        Transform::translate((Transform *)&it_1,-pSVar3->x,-pSVar3->y);
        fragment_1 = end_local._M_current;
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                   *)&fragment_1,
                                  (__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                   *)&firstFragment), bVar1) {
          pSVar4 = __gnu_cxx::
                   __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                   ::operator*((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                *)&fragment_1);
          *(SVGTextFragment **)&(pSVar4->lengthAdjustTransform).m_matrix = it_1._M_current;
          (pSVar4->lengthAdjustTransform).m_matrix.c = lengthAdjustTransform.m_matrix.a;
          (pSVar4->lengthAdjustTransform).m_matrix.d = lengthAdjustTransform.m_matrix.b;
          (pSVar4->lengthAdjustTransform).m_matrix.e = lengthAdjustTransform.m_matrix.c;
          (pSVar4->lengthAdjustTransform).m_matrix.f = lengthAdjustTransform.m_matrix.d;
          __gnu_cxx::
          __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
          ::operator++((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                        *)&fragment_1);
        }
      }
      else if ((SVGTextFragment *)0x1 < lastFragment) {
        LVar2 = SVGTextPositioningElement::lengthAdjust(pSVar3->element);
        if (LVar2 != Spacing) {
          __assert_fail("firstFragment.element->lengthAdjust() == LengthAdjust::Spacing",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0xa5,
                        "void lunasvg::handleTextChunk(SVGTextFragmentIterator, SVGTextFragmentIterator)"
                       );
        }
        uStack_90 = 0;
        local_e4 = (float)&lastFragment[-1].field_0x47;
        it_2._M_current._4_4_ = (fVar5 - numCharacters._4_4_) / local_e4;
        fragment_2 = end_local._M_current;
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                   *)&fragment_2,
                                  (__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                   *)&firstFragment), bVar1) {
          pSVar4 = __gnu_cxx::
                   __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                   ::operator*((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                                *)&fragment_2);
          local_f0 = (float)uStack_90;
          pSVar4->x = it_2._M_current._4_4_ * local_f0 + pSVar4->x;
          uStack_90 = pSVar4->length + uStack_90;
          __gnu_cxx::
          __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
          ::operator++((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                        *)&fragment_2);
        }
      }
    }
  }
  bVar1 = needsTextAnchorAdjustment(pSVar3->element);
  if (bVar1) {
    lastFragment_1._4_4_ = 0.0;
    it_3._M_current = (SVGTextFragment *)0x0;
    fragment_3 = end_local._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&fragment_3,
                              (__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&firstFragment), bVar1) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
               ::operator*((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                            *)&fragment_3);
      lastFragment_1._4_4_ = pSVar4->width + lastFragment_1._4_4_;
      if (it_3._M_current != (SVGTextFragment *)0x0) {
        lastFragment_1._4_4_ =
             (pSVar4->x - ((it_3._M_current)->x + (it_3._M_current)->width)) + lastFragment_1._4_4_;
      }
      it_3._M_current = pSVar4;
      __gnu_cxx::
      __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
      ::operator++((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                    *)&fragment_3);
    }
    it_4._M_current._4_4_ = calculateTextAnchorOffset(pSVar3->element,lastFragment_1._4_4_);
    fragment_4 = end_local._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&fragment_4,
                              (__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                               *)&firstFragment), bVar1) {
      pSVar3 = __gnu_cxx::
               __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
               ::operator*((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                            *)&fragment_4);
      pSVar3->x = it_4._M_current._4_4_ + pSVar3->x;
      __gnu_cxx::
      __normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
      ::operator++((__normal_iterator<lunasvg::SVGTextFragment_*,_std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>_>
                    *)&fragment_4);
    }
  }
  return;
}

Assistant:

static void handleTextChunk(SVGTextFragmentIterator begin, SVGTextFragmentIterator end)
{
    const SVGTextFragment& firstFragment = *begin;
    if(firstFragment.element->hasAttribute(PropertyID::TextLength)) {
        float chunkWidth = 0;
        size_t numCharacters = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            numCharacters += fragment.length;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        LengthContext lengthContext(firstFragment.element);
        auto textLength = lengthContext.valueForLength(firstFragment.element->textLength());
        if(textLength > 0.f && chunkWidth > 0.f) {
            if(firstFragment.element->lengthAdjust() == LengthAdjust::SpacingAndGlyphs) {
                auto textLengthScale = textLength / chunkWidth;
                auto lengthAdjustTransform = Transform::translated(firstFragment.x, firstFragment.y);
                lengthAdjustTransform.scale(textLengthScale, 1.f);
                lengthAdjustTransform.translate(-firstFragment.x, -firstFragment.y);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.lengthAdjustTransform = lengthAdjustTransform;
                }
            } else if(numCharacters > 1) {
                assert(firstFragment.element->lengthAdjust() == LengthAdjust::Spacing);
                size_t characterOffset = 0;
                auto textLengthShift = (textLength - chunkWidth) / (numCharacters - 1);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.x += textLengthShift * characterOffset;
                    characterOffset += fragment.length;
                }
            }
        }
    }

    if(needsTextAnchorAdjustment(firstFragment.element)) {
        float chunkWidth = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        auto chunkOffset = calculateTextAnchorOffset(firstFragment.element, chunkWidth);
        for(auto it = begin; it != end; ++it) {
            SVGTextFragment& fragment = *it;
            fragment.x += chunkOffset;
        }
    }
}